

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

void __thiscall
tsbp::LeftmostActiveOnly::DeactivatePlacement(LeftmostActiveOnly *this,Node *node,size_t nodeId)

{
  double *pdVar1;
  Packing2D *pPVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  size_t y;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  size_type pos;
  pointer pRVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  int local_6c;
  size_t local_58;
  ulong local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  int local_40;
  int local_38;
  
  (node->super_BaseNode).NodeStatus = DeactivatedPlacement;
  pPVar2 = (node->Packing)._M_t.
           super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
           super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
           super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl;
  uVar7 = (ulong)pPVar2->ActiveY;
  local_58 = nodeId;
  if ((uVar7 != 0) || (pPVar2->ActiveX != pPVar2->MaxX)) {
    lVar13 = *(long *)&(pPVar2->PlacedAreaVector).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    uVar6 = ((long)*(pointer *)
                    ((long)&(pPVar2->PlacedAreaVector).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
             lVar13 >> 3) - 1;
    uVar17 = uVar6;
    if (uVar7 < uVar6) {
      uVar16 = uVar7;
      do {
        uVar17 = uVar16;
        if ((ulong)(long)pPVar2->ActiveX < *(ulong *)(lVar13 + uVar16 * 8)) break;
        uVar16 = uVar16 + 1;
        uVar17 = uVar6;
      } while (uVar6 != uVar16);
    }
    if (pPVar2->ActiveY == 0) {
      uVar16 = (ulong)(uint)(this->container).super_Rectangle.Dx;
    }
    else {
      uVar16 = *(ulong *)(lVar13 + -8 + uVar7 * 8);
    }
    uVar8 = (uint)uVar16;
    if (uVar17 < uVar6) {
      uVar8 = (uint)*(undefined8 *)(lVar13 + uVar17 * 8);
    }
    local_50 = (ulong)uVar8;
    if ((int)(uint)uVar16 < (int)uVar8) {
      local_50 = uVar16 & 0xffffffff;
    }
    local_6c = (this->container).super_Rectangle.Dy;
    pRVar14 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar14) {
      local_48 = &pPVar2->PlacedItems;
      lVar13 = 3;
      pos = 0;
      do {
        bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (local_48,pos);
        if (!bVar5) {
          if ((this->areItemCoordinatesFixedX == true) &&
             ((ulong)(long)(this->fixedItemCoordinatesX).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[pos] < pPVar2->MinX)) {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&this->nodesToDeactivate,&local_58);
            (node->super_BaseNode).NodeStatus = InfeasibleSequence;
            return;
          }
          if ((&pRVar14->X)[lVar13] < local_6c) {
            local_6c = (&pRVar14->X)[lVar13];
          }
        }
        pos = pos + 1;
        pRVar14 = (this->items).
                  super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 8;
      } while (pos < (ulong)((long)(this->items).
                                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar14 >> 5))
      ;
    }
    uVar6 = uVar7 + 1;
    if (uVar17 - uVar7 < (ulong)(long)local_6c) {
      uVar6 = uVar17;
    }
    if (uVar7 < uVar6) {
      iVar15 = (int)local_50;
      lVar3 = *(long *)&(pPVar2->PlacedAreaVector).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      auVar19._8_4_ = iVar15 >> 0x1f;
      auVar19._0_8_ = (long)iVar15;
      auVar19._12_4_ = 0x45300000;
      lVar4 = *(long *)&(pPVar2->DeactivatedAreaVector).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      dVar20 = 0.0;
      lVar13 = 0;
      lVar9 = 0;
      dVar18 = 0.0;
      do {
        iVar11 = *(int *)(lVar3 + uVar7 * 8);
        iVar10 = *(int *)(lVar4 + uVar7 * 8);
        if (iVar10 < iVar11) {
          iVar10 = iVar11;
        }
        auVar21._8_4_ = iVar10 >> 0x1f;
        auVar21._0_8_ = (long)iVar10;
        auVar21._12_4_ = 0x45300000;
        if (uVar7 <= this->reducedItemDomainY) {
          iVar12 = (int)this->reducedItemDomainX + 1;
          iVar11 = iVar10;
          if (iVar12 < iVar10) {
            iVar11 = iVar12;
          }
          lVar9 = lVar9 + iVar11;
          if (iVar15 <= iVar12) {
            iVar12 = iVar15;
          }
          lVar13 = lVar13 + iVar12;
        }
        dVar20 = dVar20 + (auVar21._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0);
        dVar18 = dVar18 + (auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,iVar15) - 4503599627370496.0);
        *(long *)(lVar4 + uVar7 * 8) = (long)iVar15;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      dVar18 = dVar18 - dVar20;
      lVar13 = lVar13 - lVar9;
    }
    else {
      dVar18 = 0.0;
      lVar13 = 0;
    }
    dVar18 = dVar18 + pPVar2->DeactivatedArea;
    pPVar2->DeactivatedArea = dVar18;
    uVar7 = lVar13 + pPVar2->ReducedItemInfeasiblePlacementPoints;
    pPVar2->ReducedItemInfeasiblePlacementPoints = uVar7;
    dVar18 = dVar18 + pPVar2->RemainingItemAreaToPlace;
    pdVar1 = &(this->container).super_Rectangle.Area;
    if (((dVar18 < *pdVar1 || dVar18 == *pdVar1) &&
        ((pPVar2->IsReducedItemPlaced != false || (uVar7 < this->reducedItemFeasiblePlacementPoints)
         ))) && (((this->fixedItemAtOrigin).super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged != true ||
                 (pPVar2->IsFixedItemPlaced != false)))) {
      FindNewBottomLeft((LeftmostActiveOnly *)&stack0xffffffffffffffc0,(Packing2D *)this);
      pPVar2->ActiveX = local_38;
      pPVar2->ActiveY = local_40;
      return;
    }
  }
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<unsigned_long&>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->nodesToDeactivate,&local_58);
  (node->super_BaseNode).NodeStatus = InfeasibleSequence;
  return;
}

Assistant:

void LeftmostActiveOnly::DeactivatePlacement(Node& node, size_t nodeId)
{
    ////Node& node = this->tree[nodeId];
    node.NodeStatus = BaseNode::Status::DeactivatedPlacement;

    Packing2D& packing = *node.Packing;

    int placementX = packing.ActiveX;
    int placementY = packing.ActiveY;

    if (placementY == 0 && placementX == packing.MaxX)
    {
        this->nodesToDeactivate.emplace(nodeId);

        node.NodeStatus = BaseNode::Status::InfeasibleSequence;
        return;
    }

    // Determine the closest item above the current placement point. The east edge of the item is one of two bounds on the maximum x coordinate of the dummy item.
    size_t aboveMinY = packing.PlacedAreaVector.size() - 1; // TODO.Performance: - minDy
    for (size_t y = placementY; y < packing.PlacedAreaVector.size() - 1; y++)
    {
        size_t x = packing.PlacedAreaVector[y];
        ////assert(packing.Layout.DeactivatedAreaVector[y] < placementX);

        if (x > placementX)
        {
            aboveMinY = y;
            break;
        }
    }

    // Determine the other bound for the maximum x coordinate of the dummy item, i.e. the closest item below the current one.
    size_t previousX = placementY == 0 ? this->container.Dx : packing.PlacedAreaVector[placementY - 1];
    size_t xAtMinY = previousX;

    if (aboveMinY < packing.PlacedAreaVector.size() - 1)
    {
        xAtMinY = packing.PlacedAreaVector[aboveMinY];
    }

    // The maximum x coordinate of the dummy item.
    size_t disabledDx = std::min<int>(xAtMinY, previousX);

    // Determine maximum item.Dy to disable the maximum area possible.
    int minItemDy = container.Dy;
    bool infeasibleFixedSequence = false;
    const auto& placedItems = packing.PlacedItems;

    for (size_t i = 0; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];

        if (placedItems[i])
        {
            continue;
        }

        if (this->areItemCoordinatesFixedX
            ////&& !placedItems[i]
            && this->fixedItemCoordinatesX[i] < packing.MinX)
        {
            // Must be compared against MinX because after placing the current item, a new placement point might be generated with x < newActiveX, e.g. inverted L-shape.
            // Can be improved by accounting for item.Dy but requires more complicated checks.
            this->nodesToDeactivate.emplace(nodeId);
            node.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return;
        }

        minItemDy = std::min<int>(minItemDy, item.Dy);
    }

    size_t maxY = placementY + 1;
    if (minItemDy > aboveMinY - placementY)
    {
        maxY = aboveMinY;
    }

    // Deactivate complete area between the two neighboring items.
    // Complete area between items (or the top of the bin) can only be deactivated if the distance to the item above (aboveMinY - placementY) is smaller than the smallest remaining item.
    // Otherwise, it cannot because feasible solutions might be excluded. Only one horizontal bar (disabledDx) at placementY can be deactivated.
    double oldCoveredArea = 0.0;
    double updatedCoveredArea = 0.0;
    size_t oldInfeasiblePlacementPoints = 0;
    size_t updatedInfeasiblePlacementPoints = 0;
    for (size_t y = placementY; y < maxY; y++)
    ////for (size_t y = placementY; y < aboveMinY; y++)
    {
        size_t placedAreaHorizontalBarAtY = packing.PlacedAreaVector[y];
        size_t deactivatedHorizontalBarAtY = packing.DeactivatedAreaVector[y];

        size_t coveredHorizontalBarAtY = std::max<int>(placedAreaHorizontalBarAtY, deactivatedHorizontalBarAtY);

        oldCoveredArea += coveredHorizontalBarAtY;
        updatedCoveredArea += disabledDx;

        if (y <= this->reducedItemDomainY)
        {
            oldInfeasiblePlacementPoints += std::min<int>(coveredHorizontalBarAtY, this->reducedItemDomainX + 1);
            updatedInfeasiblePlacementPoints += std::min<int>(disabledDx, this->reducedItemDomainX + 1);
        }

        packing.DeactivatedAreaVector[y] = disabledDx;
    }

    packing.DeactivatedArea += (updatedCoveredArea - oldCoveredArea);
    packing.ReducedItemInfeasiblePlacementPoints += (updatedInfeasiblePlacementPoints - oldInfeasiblePlacementPoints);

    if (packing.RemainingItemAreaToPlace + packing.GetDeactivatedArea() > this->container.Area
        || (!packing.IsReducedItemPlaced && packing.ReducedItemInfeasiblePlacementPoints >= this->reducedItemFeasiblePlacementPoints)
        || fixedItemAtOrigin.has_value() && !packing.IsFixedItemPlaced)
    {
        nodesToDeactivate.emplace(nodeId);

        node.NodeStatus = BaseNode::Status::InfeasibleSequence;
        return;
    }

    // Determine new active coordinates.
    auto [newActiveX, newActiveY] = FindNewBottomLeft(packing);

    packing.ActiveX = newActiveX;
    packing.ActiveY = newActiveY;

    /*
    // Snippet for managing deactivated area with boost::geometry. Worse performance than the current solution.
    // Deprecated.Logic: account for case when activeX = binDx
    if (packing.ActiveY == 0)
    {
        // TODO.Logic: add correct deactivated area.
        return node.NodeStatus;
    }

    // TODO.Logic: must this not be before if (packing.ActiveY) ?
    packing.ActiveX = packing.BackupX;
    packing.ActiveY = packing.BackupY;

    // Add dummy item of height 1.
    const Rectangle& previouslyPlacedItem = packing.Layout.Items.back();

    // Update deactivated area. Use https://www.boost.org/doc/libs/1_76_0/libs/geometry/doc/html/geometry/reference/algorithms/union_/union__3.html
    using boost::assign::tuple_list_of;
    using boost::make_tuple;
    using bg::append;

    ////typedef bg::model::polygon<bg::model::d2::point_xy<double> > polygon;
    ////typedef bg::model::polygon<boost::tuple<int, int> > polygon;

    // Deactivate the area to the left.
    Polygon newItemDummy;
    append(newItemDummy, tuple_list_of(previouslyPlacedItem.X, previouslyPlacedItem.Y)(previouslyPlacedItem.X, previouslyPlacedItem.Y + previouslyPlacedItem.Dy + 1)(previouslyPlacedItem.X + previouslyPlacedItem.Dx, previouslyPlacedItem.Y + previouslyPlacedItem.Dy + 1)(previouslyPlacedItem.X + previouslyPlacedItem.Dx, previouslyPlacedItem.Y)(previouslyPlacedItem.X, previouslyPlacedItem.Y));

    std::vector<Polygon> output;
    bg::union_(packing.Layout.DeactivatedArea, newItemDummy, output);

    ////for (const auto& p : output)
    ////{
    ////    std::cout << "Covered area = " << bg::area(p) << "\n";
    ////}

    // For MiM, output.size() > 1 can occur.
    packing.Layout.DeactivatedArea = output.front();

    return node.NodeStatus;
    */
}